

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O3

char * ScanUintUint(FILE *out,uint *a,uint *b)

{
  uint uVar1;
  char *format;
  
  uVar1 = __isoc99_fscanf(out,"%u%u",a,b);
  if ((int)uVar1 < 0) {
    format = "output too short -- ";
  }
  else {
    if (1 < uVar1) {
      return "PASSED";
    }
    format = "bad output format -- ";
  }
  PrintWithoutBuffering(format);
  return "FAILED";
}

Assistant:

const char* ScanUintUint(FILE* out, unsigned* a, unsigned* b) {
    int status = fscanf(out, "%u%u", a, b);
    if (status < 0) {
        PrintWithoutBuffering("output too short -- ");
        return Fail;
    } else if (status < 2) {
        PrintWithoutBuffering("bad output format -- ");
        return Fail;
    }
    return Pass;
}